

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImFormatStringV(char *buf,size_t buf_size,char *fmt,__va_list_tag *args)

{
  __gnuc_va_list in_RCX;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  int w;
  int local_2c;
  int local_4;
  
  local_2c = vsnprintf(in_RDI,in_RSI,in_RDX,in_RCX);
  local_4 = local_2c;
  if (in_RDI != (char *)0x0) {
    if ((local_2c == -1) || ((int)in_RSI <= local_2c)) {
      local_2c = (int)in_RSI + -1;
    }
    in_RDI[local_2c] = '\0';
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

int ImFormatStringV(char* buf, size_t buf_size, const char* fmt, va_list args)
{
#ifdef IMGUI_USE_STB_SPRINTF
    int w = stbsp_vsnprintf(buf, (int)buf_size, fmt, args);
#else
    int w = vsnprintf(buf, buf_size, fmt, args);
#endif
    if (buf == NULL)
        return w;
    if (w == -1 || w >= (int)buf_size)
        w = (int)buf_size - 1;
    buf[w] = 0;
    return w;
}